

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

MapinfoSpawnItem * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key,MapinfoSpawnItem *value)

{
  Node *pNVar1;
  
  pNVar1 = FindKey(this,key);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = NewKey(this,key);
    MapinfoSpawnItem::MapinfoSpawnItem(&(pNVar1->Pair).Value,value);
  }
  else {
    MapinfoSpawnItem::operator=(&(pNVar1->Pair).Value,value);
  }
  return &(pNVar1->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}